

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

string * perfetto::base::StripSuffix(string *__return_storage_ptr__,string *str,string *suffix)

{
  bool bVar1;
  string *suffix_local;
  string *str_local;
  
  bVar1 = EndsWith(str,suffix);
  if (bVar1) {
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripSuffix(const std::string& str, const std::string& suffix) {
  return EndsWith(str, suffix) ? str.substr(0, str.size() - suffix.size())
                               : str;
}